

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

int __thiscall Board::get_winner(Board *this)

{
  mapped_type *pmVar1;
  uint local_24;
  int local_20;
  uint local_1c;
  int current_score;
  uint i;
  int lowest_score;
  int winner;
  Board *this_local;
  
  i = 0;
  current_score = 0x7fff;
  _lowest_score = this;
  for (local_1c = 1; local_1c < 5; local_1c = local_1c + 1) {
    local_24 = local_1c;
    pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_player_scores,(key_type *)&local_24);
    local_20 = *pmVar1;
    if (local_20 < current_score) {
      i = local_1c;
      current_score = local_20;
    }
  }
  return i;
}

Assistant:

int Board::get_winner()
{
    int winner = 0;
    int lowest_score = INT16_MAX;

    for (unsigned int i(1); i < 5; ++i) {
        int current_score = m_player_scores[i];
        if (current_score < lowest_score) {
            lowest_score = current_score;
            winner = i;
        }
    }

    return  winner;
}